

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O2

int Wln_RetComputeFfClasses(Wln_Ntk_t *pNtk,Vec_Int_t *vClasses)

{
  uint uVar1;
  int iVar2;
  int i;
  int iVar3;
  Hsh_VecMan_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Hsh_VecObj_t *pHVar4;
  int *piVar5;
  int iVar6;
  uint i_00;
  uint uVar7;
  
  p = (Hsh_VecMan_t *)calloc(1,0x48);
  iVar2 = Abc_PrimeCudd(10);
  p_00 = Vec_IntAlloc(iVar2);
  p_00->nSize = iVar2;
  if (p_00->pArray != (int *)0x0) {
    memset(p_00->pArray,0xff,(long)iVar2 << 2);
  }
  p->vTable = p_00;
  p_01 = Vec_IntAlloc(0x28);
  p->vData = p_01;
  p_02 = Vec_IntAlloc(10);
  p->vMap = p_02;
  p_03 = Vec_IntAlloc(6);
  Vec_IntFill(vClasses,(pNtk->vTypes).nSize,-1);
  iVar2 = 0;
  do {
    if ((pNtk->vFfs).nSize <= iVar2) {
      uVar1 = p_02->nSize;
      Vec_IntFree(p_00);
      Vec_IntFree(p_01);
      Vec_IntFree(p_02);
      free(p);
      Vec_IntFree(p_03);
      printf("Detected %d flops and %d flop classes.\n",(ulong)(uint)(pNtk->vFfs).nSize,(ulong)uVar1
            );
      return uVar1;
    }
    i = Vec_IntEntry(&pNtk->vFfs,iVar2);
    p_03->nSize = 0;
    for (iVar6 = 1; iVar6 != 7; iVar6 = iVar6 + 1) {
      iVar3 = Wln_ObjFanin(pNtk,i,iVar6);
      Vec_IntPush(p_03,iVar3);
    }
    iVar6 = p_00->nSize;
    if (iVar6 < p_02->nSize) {
      iVar6 = Abc_PrimeCudd(iVar6 * 2);
      Vec_IntFill(p_00,iVar6,-1);
      for (iVar6 = 0; iVar6 < p_02->nSize; iVar6 = iVar6 + 1) {
        pHVar4 = Hsh_VecObj(p,iVar6);
        iVar3 = pHVar4->nSize;
        (p->vTemp).nCap = iVar3;
        (p->vTemp).nSize = iVar3;
        (p->vTemp).pArray = &pHVar4[1].nSize;
        iVar3 = Hsh_VecManHash(&p->vTemp,p_00->nSize);
        piVar5 = Vec_IntEntryP(p_00,iVar3);
        iVar3 = *piVar5;
        pHVar4 = Hsh_VecObj(p,iVar6);
        pHVar4->iNext = iVar3;
        *piVar5 = iVar6;
      }
      iVar6 = p_00->nSize;
    }
    iVar6 = Hsh_VecManHash(p_03,iVar6);
    piVar5 = Vec_IntEntryP(p_00,iVar6);
    while( true ) {
      pHVar4 = Hsh_VecObj(p,*piVar5);
      if (pHVar4 == (Hsh_VecObj_t *)0x0) break;
      if (pHVar4->nSize == p_03->nSize) {
        iVar6 = bcmp(pHVar4 + 1,p_03->pArray,(long)pHVar4->nSize << 2);
        if (iVar6 == 0) {
          iVar6 = *piVar5;
          goto LAB_00320a9a;
        }
      }
      piVar5 = &pHVar4->iNext;
    }
    *piVar5 = p_02->nSize;
    if ((p_01->nSize & 1U) != 0) {
      __assert_fail("Vec_IntSize(p->vData) % 2 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecHsh.h"
                    ,0x216,"int Hsh_VecManAdd(Hsh_VecMan_t *, Vec_Int_t *)");
    }
    Vec_IntPush(p_02,p_01->nSize);
    uVar1 = p_03->nSize;
    Vec_IntPush(p_01,uVar1);
    Vec_IntPush(p_01,-1);
    uVar7 = 0;
    i_00 = 0;
    if (0 < (int)uVar1) {
      uVar7 = uVar1;
      i_00 = 0;
    }
    for (; uVar7 != i_00; i_00 = i_00 + 1) {
      iVar6 = Vec_IntEntry(p_03,i_00);
      Vec_IntPush(p_01,iVar6);
    }
    if ((uVar1 & 1) != 0) {
      Vec_IntPush(p_01,-1);
    }
    iVar6 = p_02->nSize + -1;
LAB_00320a9a:
    Vec_IntWriteEntry(vClasses,i,iVar6);
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

int Wln_RetComputeFfClasses( Wln_Ntk_t * pNtk, Vec_Int_t * vClasses )
{
    int i, k, iObj, nClasses;
    Hsh_VecMan_t * p = Hsh_VecManStart( 10 );
    Vec_Int_t * vFlop = Vec_IntAlloc( 6 ); 
    Vec_IntFill( vClasses, Wln_NtkObjNum(pNtk), -1 );
    Wln_NtkForEachFf( pNtk, iObj, i )
    {
        Vec_IntClear( vFlop );
        for ( k = 1; k <= 6; k++ )
            Vec_IntPush( vFlop, Wln_ObjFanin(pNtk, iObj, k) );
        Vec_IntWriteEntry( vClasses, iObj, Hsh_VecManAdd(p, vFlop) );
    }
    nClasses = Hsh_VecSize( p );
    Hsh_VecManStop( p );
    Vec_IntFree( vFlop );
    printf( "Detected %d flops and %d flop classes.\n", Wln_NtkFfNum(pNtk), nClasses );
    return nClasses;
}